

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O2

void SetSuperRound(TT_ExecContext exc,FT_F2Dot14 GridPeriod,FT_Long selector)

{
  long lVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  
  switch((uint)((ulong)selector >> 6) & 3) {
  case 0:
    uVar2 = (ulong)((ushort)GridPeriod >> 1);
    uVar3 = (uint)((ulong)selector >> 4) & 3;
    uVar4 = (ulong)uVar3;
    switch(uVar3) {
    case 0:
      goto switchD_0016e2c5_caseD_0;
    case 1:
      goto switchD_0016e2c5_caseD_1;
    case 2:
switchD_0016e2c5_caseD_2:
      uVar4 = uVar2 >> 9;
      goto switchD_0016e2c5_caseD_0;
    case 3:
switchD_0016e2c5_caseD_3:
      uVar3 = (int)uVar2 * 3;
    }
    goto LAB_0016e2f2;
  case 1:
    uVar2 = (ulong)(ushort)GridPeriod;
    uVar3 = (uint)((ulong)selector >> 4) & 3;
    uVar4 = (ulong)uVar3;
    switch(uVar3) {
    case 0:
      goto switchD_0016e2c5_caseD_0;
    case 2:
      goto switchD_0016e2c5_caseD_2;
    case 3:
      goto switchD_0016e2c5_caseD_3;
    }
    break;
  case 2:
    uVar2 = (ulong)((uint)(ushort)GridPeriod * 2);
    uVar3 = (uint)((ulong)selector >> 4) & 3;
    uVar4 = (ulong)uVar3;
    switch(uVar3) {
    case 0:
      goto switchD_0016e2c5_caseD_0;
    case 2:
      goto switchD_0016e2c5_caseD_2;
    case 3:
      goto switchD_0016e2c5_caseD_3;
    }
    break;
  case 3:
    uVar2 = (ulong)(ushort)GridPeriod;
    uVar3 = (uint)((ulong)selector >> 4) & 3;
    uVar4 = (ulong)uVar3;
    switch(uVar3) {
    case 0:
      goto switchD_0016e2c5_caseD_0;
    case 2:
      goto switchD_0016e2c5_caseD_2;
    case 3:
      goto switchD_0016e2c5_caseD_3;
    }
  }
switchD_0016e2c5_caseD_1:
  uVar3 = (uint)uVar2;
LAB_0016e2f2:
  uVar4 = (ulong)(uVar3 >> 10);
switchD_0016e2c5_caseD_0:
  if ((selector & 0xfU) == 0) {
    lVar1 = uVar2 - 1;
  }
  else {
    lVar1 = (long)((int)(((int)(selector & 0xfU) + -4) * (uint)uVar2) / 8);
  }
  exc->period = (ulong)((uint)uVar2 >> 8);
  exc->phase = uVar4;
  exc->threshold = lVar1 >> 8;
  return;
}

Assistant:

static void
  SetSuperRound( TT_ExecContext  exc,
                 FT_F2Dot14      GridPeriod,
                 FT_Long         selector )
  {
    switch ( (FT_Int)( selector & 0xC0 ) )
    {
      case 0:
        exc->period = GridPeriod / 2;
        break;

      case 0x40:
        exc->period = GridPeriod;
        break;

      case 0x80:
        exc->period = GridPeriod * 2;
        break;

      /* This opcode is reserved, but... */
      case 0xC0:
        exc->period = GridPeriod;
        break;
    }

    switch ( (FT_Int)( selector & 0x30 ) )
    {
    case 0:
      exc->phase = 0;
      break;

    case 0x10:
      exc->phase = exc->period / 4;
      break;

    case 0x20:
      exc->phase = exc->period / 2;
      break;

    case 0x30:
      exc->phase = exc->period * 3 / 4;
      break;
    }

    if ( ( selector & 0x0F ) == 0 )
      exc->threshold = exc->period - 1;
    else
      exc->threshold = ( (FT_Int)( selector & 0x0F ) - 4 ) * exc->period / 8;

    /* convert to F26Dot6 format */
    exc->period    >>= 8;
    exc->phase     >>= 8;
    exc->threshold >>= 8;
  }